

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::default_cost_type<float>::make_l2_norm(default_cost_type<float> *this,int n)

{
  float *pfVar1;
  float fVar2;
  int i;
  ulong uVar3;
  float fVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  
  if (n == 0) {
    auVar5 = ZEXT864(0);
  }
  else {
    auVar5 = ZEXT864(0);
    uVar3 = 0;
    do {
      auVar6 = ZEXT416((uint)(this->linear_elements)._M_t.
                             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                             super__Head_base<0UL,_float_*,_false>._M_head_impl[uVar3]);
      auVar6 = vfmadd231ss_fma(auVar5._0_16_,auVar6,auVar6);
      auVar5 = ZEXT1664(auVar6);
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  fVar4 = auVar5._0_4_;
  fVar2 = ABS(fVar4);
  if ((n != 0 && (uint)fVar2 < 0x7f800001) &&
      (0x7ffffe < (int)fVar2 - 1U && (fVar2 != INFINITY && fVar4 != 0.0))) {
    pfVar1 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    uVar3 = 0;
    do {
      pfVar1[uVar3] = pfVar1[uVar3] / fVar4;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }